

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_performance2(void)

{
  int iVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  long lVar3;
  bool bVar4;
  allocator local_479;
  string str;
  person p;
  type local_428;
  rpc_client client;
  
  std::__cxx11::string::string((string *)&p,"127.0.0.1",(allocator *)&str);
  rest_rpc::rpc_client::rpc_client(&client,(string *)&p,9000);
  std::__cxx11::string::~string((string *)&p);
  iVar1 = rest_rpc::rpc_client::connect(&client,3,(sockaddr *)0x0,in_ECX);
  if ((char)iVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"connect timeout");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    p.id = 1;
    std::__cxx11::string::string((string *)&p.name,"tom",(allocator *)&str);
    p.age = 0x14;
    lVar3 = 100000000;
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      std::__cxx11::string::string((string *)&str,"get_name",&local_479);
      rest_rpc::rpc_client::call<5000ul,std::__cxx11::string,person&>(&local_428,&client,&str,&p);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&str);
    }
    std::operator<<((ostream *)&std::cout,"finish\n");
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::string::~string((string *)&p.name);
  }
  rest_rpc::rpc_client::~rpc_client(&client);
  return;
}

Assistant:

void test_performance2() {
  rpc_client client("127.0.0.1", 9000);
  bool r = client.connect();
  if (!r) {
    std::cout << "connect timeout" << std::endl;
    return;
  }

  person p{1, "tom", 20};

  try {
    for (size_t i = 0; i < 100000000; i++) {
      client.call<std::string>("get_name", p);
    }
    std::cout << "finish\n";
  } catch (const std::exception &ex) {
    std::cout << ex.what() << '\n';
  }

  std::string str;
  std::cin >> str;
}